

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_utils.c
# Opt level: O2

void bake_insert_uni_query_db(char *table_name,int field_count,char **query)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  uint uVar4;
  uint uVar5;
  
  sVar3 = strlen(table_name);
  iVar1 = (int)sVar3 + 0x18;
  uVar5 = 0;
  uVar4 = 0;
  if (0 < field_count) {
    uVar5 = field_count;
    uVar4 = 0;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = (iVar1 - (uint)(uVar4 < 10)) + 5;
  }
  sVar3 = (size_t)iVar1;
  __s = (char *)malloc(sVar3);
  *query = __s;
  if (__s == (char *)0x0) {
    return;
  }
  iVar1 = snprintf(__s,sVar3,"%s%s%s","INSERT INTO ",table_name," VALUES (");
  uVar5 = 1;
  uVar4 = 1;
  if (1 < field_count) {
    uVar4 = field_count;
  }
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    iVar2 = snprintf(*query + iVar1,sVar3,"?%i, ",(ulong)uVar5);
    iVar1 = iVar1 + iVar2;
  }
  iVar2 = snprintf(*query + iVar1,sVar3,"?%i ",(ulong)(uint)field_count);
  snprintf(*query + (iVar2 + iVar1),sVar3,"%s",");");
  return;
}

Assistant:

void bake_insert_uni_query_db(const char *table_name, int field_count, char **query) {
    char *query_beginning = "INSERT INTO ";
    char *query_middle = " VALUES (";
    char *query_ending = ");";

    int sql_insert_query_length = strlen(query_beginning) + strlen(table_name) + strlen(query_middle) + strlen(query_ending) + 1;
    for (int i = 0; i < field_count; i++)
        sql_insert_query_length += 4 + ((i > 9) ? 1 : 0);


    *query = malloc(sql_insert_query_length * sizeof(char));
    if (*query == NULL) {
        return;
    }
    int insert_pos = 0;

    insert_pos += snprintf(*query, sql_insert_query_length, "%s%s%s", query_beginning, table_name, query_middle);
    for (int i = 0; i < field_count - 1; i++)
        insert_pos += snprintf(*query + insert_pos, sql_insert_query_length, "?%i, ", i + 1);
    insert_pos += snprintf(*query + insert_pos, sql_insert_query_length, "?%i ", field_count - 1 + 1);
    insert_pos += snprintf(*query + insert_pos, sql_insert_query_length, "%s", query_ending);
}